

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_54;
  int local_50;
  int fAttr1;
  int fAttr0;
  int Counter;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  int *fWarning_local;
  Vec_Int_t *vCubeFree_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  piVar1 = vArr1->pArray;
  piVar2 = vArr2->pArray;
  piVar3 = vArr1->pArray;
  iVar6 = vArr1->nSize;
  piVar4 = vArr2->pArray;
  iVar7 = vArr2->nSize;
  fAttr1 = 0;
  local_50 = 0;
  local_54 = 1;
  Vec_IntClear(vCubeFree);
  pEnd1 = piVar2 + 1;
  pBeg2 = piVar1 + 1;
  while (pBeg2 < piVar3 + iVar6 && pEnd1 < piVar4 + iVar7) {
    if (*pBeg2 == *pEnd1) {
      fAttr1 = fAttr1 + 1;
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      iVar5 = Abc_Var2Lit(*pBeg2,local_50);
      Vec_IntPush(vCubeFree,iVar5);
      pBeg2 = pBeg2 + 1;
    }
    else {
      iVar5 = Vec_IntSize(vCubeFree);
      if (iVar5 == 0) {
        local_50 = 1;
        local_54 = 0;
      }
      iVar5 = Abc_Var2Lit(*pEnd1,local_54);
      Vec_IntPush(vCubeFree,iVar5);
      pEnd1 = pEnd1 + 1;
    }
  }
  while (pBeg2 < piVar3 + iVar6) {
    iVar5 = Abc_Var2Lit(*pBeg2,local_50);
    Vec_IntPush(vCubeFree,iVar5);
    pBeg2 = pBeg2 + 1;
  }
  while (pEnd1 < piVar4 + iVar7) {
    iVar6 = Abc_Var2Lit(*pEnd1,local_54);
    Vec_IntPush(vCubeFree,iVar6);
    pEnd1 = pEnd1 + 1;
  }
  iVar6 = Vec_IntSize(vCubeFree);
  if (iVar6 == 0) {
    printf("The SOP has duplicated cubes.\n");
  }
  else {
    iVar6 = Vec_IntSize(vCubeFree);
    if (iVar6 == 1) {
      printf("The SOP has contained cubes.\n");
    }
    else {
      iVar6 = Vec_IntSize(vCubeFree);
      if (iVar6 == 2) {
        iVar6 = Vec_IntEntry(vCubeFree,0);
        iVar6 = Abc_Lit2Var(iVar6);
        iVar6 = Abc_Lit2Var(iVar6);
        iVar7 = Vec_IntEntry(vCubeFree,1);
        iVar7 = Abc_Lit2Var(iVar7);
        iVar7 = Abc_Lit2Var(iVar7);
        if ((iVar6 == iVar7) && (*fWarning == 0)) {
          printf(
                "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n"
                );
          *fWarning = 1;
        }
      }
    }
  }
  iVar6 = Vec_IntEntry(vCubeFree,0);
  iVar6 = Abc_LitIsCompl(iVar6);
  if (iVar6 == 0) {
    return fAttr1;
  }
  __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                ,0x29d,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vArr1->pArray + 1;  // skip variable ID
    int * pBeg2 = vArr2->pArray + 1;  // skip variable ID
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        printf( "The SOP has contained cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 2 && Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 0))) == Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 1))) && !*fWarning )
        printf( "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n" ), *fWarning = 1;
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}